

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STValidation.cpp
# Opt level: O2

void __thiscall
jbcoin::STValidation::STValidation
          (STValidation *this,uint256 *ledgerHash,time_point signTime,PublicKey *publicKey,
          bool isFull)

{
  atomic<int> *paVar1;
  bool bVar2;
  Counter *pCVar3;
  NodeID local_40;
  
  getFormat();
  STObject::STObject(&this->super_STObject,&getFormat::holder.format,(SField *)sfValidation);
  pCVar3 = CountedObject<jbcoin::STValidation>::getCounter();
  LOCK();
  paVar1 = &(pCVar3->super_CounterBase).m_count;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  (this->super_STObject).super_STBase._vptr_STBase = (_func_int **)&PTR__STValidation_002f91d0;
  (this->mNodeID).pn[0] = 0;
  (this->mNodeID).pn[1] = 0;
  (this->mNodeID).pn[2] = 0;
  (this->mNodeID).pn[3] = 0;
  *(undefined8 *)((long)(this->mNodeID).pn + 0xd) = 0;
  (this->mSeen).__d.__r = (rep_conflict)signTime.__d.__r;
  STObject::setFieldH256(&this->super_STObject,(SField *)sfLedgerHash,ledgerHash);
  STObject::setFieldUsingSetValue<jbcoin::STInteger<unsigned_int>,unsigned_int>
            (&this->super_STObject,(SField *)sfSigningTime,(uint)signTime.__d.__r);
  local_40.pn._0_8_ = publicKey->buf_;
  local_40.pn._8_8_ = publicKey->size_;
  STObject::setFieldVL(&this->super_STObject,(SField *)sfSigningPubKey,(Slice *)&local_40);
  calcNodeID(&local_40,publicKey);
  base_uint<160UL,_jbcoin::detail::NodeIDTag>::operator=(&this->mNodeID,&local_40);
  bVar2 = beast::operator!=(&this->mNodeID);
  if (bVar2) {
    if (isFull) {
      STObject::setFlag(&this->super_STObject,1);
    }
    return;
  }
  __assert_fail("mNodeID.isNonZero ()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/STValidation.cpp"
                ,0x3a,
                "jbcoin::STValidation::STValidation(const uint256 &, NetClock::time_point, const PublicKey &, bool)"
               );
}

Assistant:

STValidation::STValidation (
        uint256 const& ledgerHash,
        NetClock::time_point signTime,
        PublicKey const& publicKey,
        bool isFull)
    : STObject (getFormat (), sfValidation)
    , mSeen (signTime)
{
    // Does not sign
    setFieldH256 (sfLedgerHash, ledgerHash);
    setFieldU32 (sfSigningTime, signTime.time_since_epoch().count());

    setFieldVL (sfSigningPubKey, publicKey.slice());
    mNodeID = calcNodeID(publicKey);
    assert (mNodeID.isNonZero ());

    if (isFull)
        setFlag (kFullFlag);
}